

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool ClipperLib::FirstIsBottomPt(OutPt *btmPt1,OutPt *btmPt2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  OutPt *pOVar5;
  double dVar6;
  double dVar7;
  byte bVar8;
  double dVar9;
  double dVar10;
  
  lVar1 = (btmPt1->pt).X;
  lVar2 = (btmPt1->pt).Y;
  pOVar5 = btmPt1;
  do {
    pOVar5 = pOVar5->prev;
    lVar3 = (pOVar5->pt).X;
    lVar4 = (pOVar5->pt).Y;
    if ((pOVar5 == btmPt1) || (lVar3 != lVar1)) break;
  } while (lVar4 == lVar2);
  lVar4 = lVar4 - lVar2;
  pOVar5 = btmPt1;
  if (lVar4 == 0) {
    dVar6 = -1e+40;
  }
  else {
    dVar6 = (double)(lVar3 - lVar1) / (double)lVar4;
  }
  do {
    pOVar5 = pOVar5->next;
    lVar3 = (pOVar5->pt).X;
    lVar4 = (pOVar5->pt).Y;
    if ((pOVar5 == btmPt1) || (lVar3 != lVar1)) break;
  } while (lVar4 == lVar2);
  lVar4 = lVar4 - lVar2;
  if (lVar4 == 0) {
    dVar7 = -1e+40;
  }
  else {
    dVar7 = (double)(lVar3 - lVar1) / (double)lVar4;
  }
  lVar1 = (btmPt2->pt).X;
  lVar2 = (btmPt2->pt).Y;
  pOVar5 = btmPt2;
  do {
    pOVar5 = pOVar5->prev;
    lVar3 = (pOVar5->pt).X;
    lVar4 = (pOVar5->pt).Y;
    if ((pOVar5 == btmPt2) || (lVar3 != lVar1)) break;
  } while (lVar4 == lVar2);
  lVar4 = lVar4 - lVar2;
  pOVar5 = btmPt2;
  if (lVar4 == 0) {
    dVar9 = -1e+40;
  }
  else {
    dVar9 = (double)(lVar3 - lVar1) / (double)lVar4;
  }
  do {
    pOVar5 = pOVar5->next;
    lVar3 = (pOVar5->pt).X;
    lVar4 = (pOVar5->pt).Y;
    if ((pOVar5 == btmPt2) || (lVar3 != lVar1)) break;
  } while (lVar4 == lVar2);
  lVar4 = lVar4 - lVar2;
  if (lVar4 == 0) {
    dVar10 = -1e+40;
  }
  else {
    dVar10 = (double)(lVar3 - lVar1) / (double)lVar4;
  }
  if ((ABS(dVar6) < ABS(dVar9)) || (bVar8 = 1, ABS(dVar6) < ABS(dVar10))) {
    bVar8 = -(ABS(dVar9) <= ABS(dVar7)) & -(ABS(dVar10) <= ABS(dVar7));
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool FirstIsBottomPt(const OutPt* btmPt1, const OutPt* btmPt2)
{
  OutPt *p = btmPt1->prev;
  while (PointsEqual(p->pt, btmPt1->pt) && (p != btmPt1)) p = p->prev;
  double dx1p = std::fabs(GetDx(btmPt1->pt, p->pt));
  p = btmPt1->next;
  while (PointsEqual(p->pt, btmPt1->pt) && (p != btmPt1)) p = p->next;
  double dx1n = std::fabs(GetDx(btmPt1->pt, p->pt));

  p = btmPt2->prev;
  while (PointsEqual(p->pt, btmPt2->pt) && (p != btmPt2)) p = p->prev;
  double dx2p = std::fabs(GetDx(btmPt2->pt, p->pt));
  p = btmPt2->next;
  while (PointsEqual(p->pt, btmPt2->pt) && (p != btmPt2)) p = p->next;
  double dx2n = std::fabs(GetDx(btmPt2->pt, p->pt));
  return (dx1p >= dx2p && dx1p >= dx2n) || (dx1n >= dx2p && dx1n >= dx2n);
}